

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::erase(iterator *__return_storage_ptr__,
       Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
       *this,iterator pos)

{
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  *this_00;
  iterator it;
  iterator i;
  
  it.it_ = pos.it_;
  this_00 = ((pos.it_.node_)->kv).v_;
  InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::operator++(&pos.it_);
  InnerMap::erase(this->elements_,it.it_);
  if (this->arena_ == (Arena *)0x0) {
    if (this_00 !=
        (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
         *)0x0) {
      MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::~MapPair(this_00);
    }
    operator_delete(this_00);
  }
  (__return_storage_ptr__->it_).bucket_index_ = pos.it_.bucket_index_;
  (__return_storage_ptr__->it_).node_ = pos.it_.node_;
  (__return_storage_ptr__->it_).m_ = pos.it_.m_;
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) {
    value_type* value = pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    // Note: we need to delete the value after erasing from the inner map
    // because the inner map's key may be a view of the value's key.
    if (arena_ == nullptr) delete value;
    return pos;
  }